

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::writeStylesheetRef(XmlWriter *this,string *url)

{
  ostream *poVar1;
  string *in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<(*(ostream **)(in_RDI + 0x40),"<?xml-stylesheet type=\"text/xsl\" href=\""
                          );
  poVar1 = std::operator<<(poVar1,in_RSI);
  std::operator<<(poVar1,"\"?>\n");
  return;
}

Assistant:

void XmlWriter::writeStylesheetRef( std::string const& url ) {
        m_os << "<?xml-stylesheet type=\"text/xsl\" href=\"" << url << "\"?>\n";
    }